

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::
     ToProperty<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
               (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                *input,Property *output,string *err)

{
  double t;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *pvVar1;
  pointer extraout_RAX;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *__x;
  Value val;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> a;
  PrimVar pvar;
  Attribute attr;
  optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  aval;
  storage_union local_940;
  undefined **local_930;
  TimeSamples local_928;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  *local_900;
  storage_union local_8f8;
  pointer local_8e8;
  undefined1 local_8e0;
  undefined1 local_8d8 [24];
  bool local_8c0;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  undefined1 local_610 [8];
  undefined1 local_608 [32];
  TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  local_5e8;
  any local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  ListEditQual local_368;
  Type TStack_364;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  local_8b8._0_8_ = local_8b8 + 0x10;
  local_8b8._8_8_ = 0;
  local_8b8[0x10] = '\0';
  local_8b8[0x24] = false;
  local_890._M_p = (pointer)&local_880;
  local_888 = 0;
  local_880._M_local_buf[0] = '\0';
  local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_870.dynamic = (void *)0x0;
  local_858 = false;
  local_850._0_8_ = (pointer)0x0;
  local_850[8] = 0;
  local_850._9_7_ = 0;
  local_850[0x10] = 0;
  local_850._17_8_ = 0;
  AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_818.elementSize.has_value_ = false;
  AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_818.hidden.has_value_ = false;
  AStack_818.hidden.contained = (storage_t<bool>)0x0;
  AStack_818.comment.has_value_ = false;
  AStack_818.weight.contained = (storage_t<double>)0x0;
  AStack_818.connectability.has_value_ = false;
  AStack_818.bindMaterialAs.contained._16_8_ = 0;
  AStack_818.bindMaterialAs.contained._24_8_ = 0;
  AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.bindMaterialAs.contained._8_8_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.comment.contained._8_8_ = 0;
  AStack_818.comment.contained._16_8_ = 0;
  AStack_818.comment.contained._24_8_ = 0;
  AStack_818.comment.contained._32_8_ = 0;
  AStack_818.comment.contained._40_8_ = 0;
  AStack_818.customData.has_value_ = false;
  AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.customData.contained._8_8_ = 0;
  AStack_818.customData.contained._16_8_ = 0;
  AStack_818.customData.contained._24_8_ = 0;
  AStack_818.customData.contained._32_8_ = 0;
  AStack_818.customData.contained._40_8_ = 0;
  AStack_818.weight.has_value_ = false;
  AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.connectability.contained._8_8_ = 0;
  AStack_818.connectability.contained._16_8_ = 0;
  AStack_818.connectability.contained._24_8_ = 0;
  AStack_818.outputName.has_value_ = false;
  AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.outputName.contained._8_8_ = 0;
  AStack_818.outputName.contained._16_8_ = 0;
  AStack_818.outputName.contained._24_8_ = 0;
  AStack_818.renderType.has_value_ = false;
  AStack_818.sdrMetadata.has_value_ = false;
  AStack_818.renderType.contained._16_8_ = 0;
  AStack_818.renderType.contained._24_8_ = 0;
  AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.renderType.contained._8_8_ = 0;
  AStack_818.displayName.has_value_ = false;
  AStack_818.sdrMetadata.contained._32_8_ = 0;
  AStack_818.sdrMetadata.contained._40_8_ = 0;
  AStack_818.sdrMetadata.contained._16_8_ = 0;
  AStack_818.sdrMetadata.contained._24_8_ = 0;
  AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.sdrMetadata.contained._8_8_ = 0;
  AStack_818.displayGroup.has_value_ = false;
  AStack_818.displayName.contained._16_8_ = 0;
  AStack_818.displayName.contained._24_8_ = 0;
  AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayName.contained._8_8_ = 0;
  AStack_818.bindMaterialAs.has_value_ = false;
  AStack_818.displayGroup.contained._16_8_ = 0;
  AStack_818.displayGroup.contained._24_8_ = 0;
  AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayGroup.contained._8_8_ = 0;
  local_830[0x10] = 0;
  stack0xfffffffffffff7e1 = 0;
  local_830._0_8_ = (pointer)0x0;
  local_830[8] = 0;
  local_830._9_7_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b8._32_4_ = Varying;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tinyusdz::value::
  TypeTraits<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>::
  type_name_abi_cxx11_();
  ::std::__cxx11::string::_M_assign((string *)&local_890);
  if ((undefined1 *)CONCAT71(local_610._1_7_,local_610[0]) != local_608 + 8) {
    operator_delete((undefined1 *)CONCAT71(local_610._1_7_,local_610[0]),local_608._8_8_ + 1);
  }
  if (input->_blocked == true) {
    local_858 = true;
  }
  if ((input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,&input->_paths);
  }
  local_8e8 = (pointer)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_8f8.dynamic = (void *)0x0;
  local_8e0 = 0;
  local_8d8._0_8_ = (pointer)0x0;
  local_8d8[8] = 0;
  local_8d8._9_7_ = 0;
  local_8d8[0x10] = 0;
  stack0xfffffffffffff739 = 0;
  nonstd::optional_lite::
  optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  ::optional((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              *)local_610,&input->_attrib);
  if (local_610[0] != true) {
LAB_00361185:
    if (local_610[0] == true) {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
      ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                        *)local_608);
    }
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_8d8);
    if (local_8e8 != (pointer)0x0) {
      (**(code **)((long)local_8e8 + 0x20))(&local_8f8);
      local_8e8 = (pointer)0x0;
    }
    AttrMetas::operator=(&AStack_818,&input->_metas);
    Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
    ::std::__cxx11::string::operator=((string *)output,(string *)local_610);
    (output->_attrib)._variability = local_608._24_4_;
    (output->_attrib)._varying_authored = (bool)local_608[0x1c];
    ::std::__cxx11::string::operator=((string *)&(output->_attrib)._type_name,(string *)&local_5e8);
    linb::any::operator=((any *)&(output->_attrib)._var,&local_5c8);
    (output->_attrib)._var._blocked = local_5b0;
    local_8f8.dynamic =
         (output->_attrib)._var._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_8f8._8_8_ =
         *(pointer *)
          ((long)&(output->_attrib)._var._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data + 8);
    local_8e8 = *(pointer *)
                 ((long)&(output->_attrib)._var._ts._samples.
                         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         ._M_impl.super__Vector_impl_data + 0x10);
    (output->_attrib)._var._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = local_5a8;
    *(pointer *)
     ((long)&(output->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data + 8) = local_5a0;
    *(pointer *)
     ((long)&(output->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data + 0x10) = local_598;
    local_5a8 = (pointer)0x0;
    local_5a0 = (pointer)0x0;
    local_598 = (pointer)0x0;
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)&local_8f8);
    (output->_attrib)._var._ts._dirty = local_590;
    local_8f8.dynamic =
         (output->_attrib)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_8f8._8_8_ =
         (output->_attrib)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_8e8 = (output->_attrib)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    (output->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_start = local_588;
    (output->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = local_580;
    (output->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_578;
    local_588 = (pointer)0x0;
    local_580 = (pointer)0x0;
    local_578 = (pointer)0x0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_8f8);
    AttrMetas::operator=(&(output->_attrib)._metas,&AStack_570);
    output->_listOpQual = local_368;
    output->_type = TStack_364;
    (output->_rel).type = local_360;
    Path::operator=(&(output->_rel).targetPath,&PStack_358);
    local_8f8.dynamic =
         (output->_rel).targetPathVector.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_8f8._8_8_ =
         (output->_rel).targetPathVector.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_8e8 = (output->_rel).targetPathVector.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    (output->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = local_288;
    (output->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = local_280;
    (output->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_278;
    local_288 = (pointer)0x0;
    local_280 = (pointer)0x0;
    local_278 = (pointer)0x0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_8f8);
    (output->_rel).listOpQual = local_270;
    AttrMetas::operator=(&(output->_rel)._metas,&AStack_268);
    (output->_rel)._varying_authored = local_60;
    ::std::__cxx11::string::operator=((string *)&output->_prop_value_type_name,asStack_58);
    output->_has_custom = local_38;
    Property::~Property((Property *)local_610);
    AttrMetas::~AttrMetas(&AStack_818);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_850);
    if (local_860 != (vtable_type *)0x0) {
      (*local_860->destroy)(&local_870);
      local_860 = (vtable_type *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890._M_p != &local_880) {
      operator_delete(local_890._M_p,
                      CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1)
      ;
    }
    pcVar2 = local_8b8 + 0x10;
    if ((pointer)local_8b8._0_8_ != pcVar2) {
      operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
      pcVar2 = extraout_RAX;
    }
    return SUB81(pcVar2,0);
  }
  if (local_608[0x19] == '\x01') {
    local_858 = true;
  }
  if (local_608[0x18] == '\x01') {
    local_928._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_928._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_928._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_928._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_928._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    if (local_608[0x19] == '\0') {
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::operator=
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_928,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 local_608);
      local_930 = &linb::any::
                   vtable_for_type<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>()
                   ::table;
      pvVar1 = (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
               operator_new(0x18);
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                (pvVar1,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                        &local_928);
      local_940.dynamic = pvVar1;
      linb::any::operator=((any *)&local_8f8,(any *)&local_940);
      if (local_930 != (undefined **)0x0) {
        (*(code *)local_930[4])(&local_940);
        local_930 = (undefined **)0x0;
      }
    }
    if (local_928._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_928._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT71(local_928._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               local_928._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                      (long)local_928._samples.
                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_610[0] != false) {
    if (local_5e8._dirty == true) {
      TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
      ::update(&local_5e8);
    }
    if (local_5e8._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_5e8._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (local_610[0] == false) goto LAB_003614bb;
      local_900 = input;
      if (local_5e8._dirty == true) {
        TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
        ::update(&local_5e8);
      }
      local_928._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_928._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      local_928._dirty = false;
      local_928._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_928._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_928._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      if (local_5e8._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_5e8._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar4 = 8;
        uVar3 = 0;
        do {
          t = *(double *)
               ((long)local_5e8._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start + -8 + lVar4);
          __x = (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                ((long)local_5e8._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4);
          local_930 = &linb::any::
                       vtable_for_type<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>()
                       ::table;
          pvVar1 = (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   operator_new(0x18);
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                    (pvVar1,__x);
          local_940.dynamic = pvVar1;
          tinyusdz::value::TimeSamples::add_sample(&local_928,t,(Value *)&local_940);
          if (local_930 != (undefined **)0x0) {
            (*(code *)local_930[4])(&local_940);
            local_930 = (undefined **)0x0;
          }
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 0x28;
        } while (uVar3 < (ulong)(((long)local_5e8._samples.
                                        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_5e8._samples.
                                        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x3333333333333333));
      }
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_8d8,&local_928._samples);
      stack0xfffffffffffff739 = CONCAT17(local_928._dirty,local_8d8._17_7_);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector(&local_928._samples);
      input = local_900;
    }
    if (local_610[0] != false) {
      if (local_608[0x18] == '\0') {
        if (local_5e8._dirty == true) {
          TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
          ::update(&local_5e8);
        }
        if (local_5e8._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_5e8._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) goto LAB_00361185;
      }
      Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_8f8);
      goto LAB_00361185;
    }
  }
LAB_003614bb:
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x591,
                "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<std::array<float, 3>>>>::value() [T = tinyusdz::Animatable<std::vector<std::array<float, 3>>>]"
               );
}

Assistant:

bool ToProperty(const TypedAttribute<Animatable<T>> &input, Property &output, std::string *err) {

  DCOUT("ToProperty ");
  (void)err;

  Attribute attr;

  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections" << input.has_connections());
  DCOUT("has_value " << input.has_value());
  DCOUT("is_blocked " << input.is_blocked());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    

    attr.set_connections(input.get_connections());
  }

  //DCOUT("has_default " << input.has_default());
  //DCOUT("has_timesamples " << input.has_timesamples());

  {
    primvar::PrimVar pvar;

    // Includes !authored()
    nonstd::optional<Animatable<T>> aval = input.get_value();
    if (aval) {

      if (aval.value().is_blocked()) {
        attr.set_blocked(true);
      }

      if (aval.value().has_value()) {
        T a;
        if (aval.value().get_default(&a)) {
          value::Value val(a);
          pvar.set_value(val);
        }
      }

      if (aval.value().has_timesamples()) {
        value::TimeSamples ts = ToTypelessTimeSamples(aval.value().get_timesamples());
        pvar.set_timesamples(ts);
      }

      if (aval.value().has_value() || aval.value().has_timesamples()) {
        attr.set_var(std::move(pvar));
      }

    } else {
      DCOUT("no animatable value.");
    }
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /*custom*/ false);

  return true;
}